

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O3

void anon_unknown.dwarf_2e9fb6::compareImages(char *fileName1,char *fileName2)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  undefined4 in_ECX;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  float fVar15;
  RgbaInputFile in1;
  RgbaInputFile in2;
  Rgba local_b0 [8];
  Rgba local_70 [8];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing files ",0x10);
  if (fileName1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar2 = strlen(fileName1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  if (fileName2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar2 = strlen(fileName2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName2,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_b0,fileName1,iVar1);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_70,fileName2,iVar1);
  puVar3 = (undefined8 *)Imf_3_4::RgbaInputFile::dataWindow();
  puVar4 = (undefined8 *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar1 = -(uint)((int)*puVar4 == (int)*puVar3);
  iVar14 = -(uint)((int)((ulong)*puVar4 >> 0x20) == (int)((ulong)*puVar3 >> 0x20));
  auVar12._4_4_ = iVar1;
  auVar12._0_4_ = iVar1;
  auVar12._8_4_ = iVar14;
  auVar12._12_4_ = iVar14;
  iVar1 = movmskpd(in_ECX,auVar12);
  if ((iVar1 != 3) ||
     (iVar1 = -(uint)((int)puVar4[1] == (int)puVar3[1]),
     iVar14 = -(uint)((int)((ulong)puVar4[1] >> 0x20) == (int)((ulong)puVar3[1] >> 0x20)),
     auVar13._4_4_ = iVar1, auVar13._0_4_ = iVar1, auVar13._8_4_ = iVar14, auVar13._12_4_ = iVar14,
     iVar1 = movmskpd((int)puVar4,auVar13), iVar1 != 3)) {
    __assert_fail("in1.dataWindow () == in2.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                  ,0x4d,"void (anonymous namespace)::compareImages(const char *, const char *)");
  }
  piVar5 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar1 = *piVar5;
  iVar11 = (piVar5[2] - iVar1) + 1;
  iVar14 = piVar5[1];
  uVar10 = ((piVar5[3] - iVar14) + 1) * iVar11;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)uVar10) {
    uVar8 = (long)(int)uVar10 * 8;
  }
  pvVar6 = operator_new__(uVar8);
  pvVar7 = operator_new__(uVar8);
  lVar9 = (long)(iVar14 * iVar11);
  Imf_3_4::RgbaInputFile::setFrameBuffer(local_b0,(long)pvVar6 + lVar9 * -8 + (long)iVar1 * -8,1);
  Imf_3_4::RgbaInputFile::setFrameBuffer(local_70,(long)pvVar7 + lVar9 * -8 + (long)iVar1 * -8,1);
  lVar9 = Imf_3_4::RgbaInputFile::dataWindow();
  iVar1 = *(int *)(lVar9 + 4);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::readPixels((int)local_b0,iVar1);
  lVar9 = Imf_3_4::RgbaInputFile::dataWindow();
  iVar1 = *(int *)(lVar9 + 4);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::readPixels((int)local_70,iVar1);
  if (0 < (int)uVar10) {
    uVar8 = 0;
    do {
      fVar15 = (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar6 + uVar8 * 8) * 4) + 0.01) /
               (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar7 + uVar8 * 8) * 4) + 0.01);
      if ((fVar15 < 0.9) || (1.1 < fVar15)) {
        __assert_fail("approximatelyEqual (pixels1[i].r, pixels2[i].r)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                      ,0x61,"void (anonymous namespace)::compareImages(const char *, const char *)")
        ;
      }
      fVar15 = (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar6 + uVar8 * 8 + 2) * 4) + 0.01) /
               (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar7 + uVar8 * 8 + 2) * 4) + 0.01);
      if ((fVar15 < 0.9) || (1.1 < fVar15)) {
        __assert_fail("approximatelyEqual (pixels1[i].g, pixels2[i].g)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                      ,0x62,"void (anonymous namespace)::compareImages(const char *, const char *)")
        ;
      }
      fVar15 = (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar6 + uVar8 * 8 + 4) * 4) + 0.01) /
               (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar7 + uVar8 * 8 + 4) * 4) + 0.01);
      if ((fVar15 < 0.9) || (1.1 < fVar15)) {
        __assert_fail("approximatelyEqual (pixels1[i].b, pixels2[i].b)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                      ,99,"void (anonymous namespace)::compareImages(const char *, const char *)");
      }
      fVar15 = (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar6 + uVar8 * 8 + 6) * 4) + 0.01) /
               (*(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar7 + uVar8 * 8 + 6) * 4) + 0.01);
      if ((fVar15 < 0.9) || (1.1 < fVar15)) {
        __assert_fail("approximatelyEqual (pixels1[i].a, pixels2[i].a)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                      ,100,"void (anonymous namespace)::compareImages(const char *, const char *)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  operator_delete__(pvVar7);
  operator_delete__(pvVar6);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_70);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_b0);
  return;
}

Assistant:

void
compareImages (const char fileName1[], const char fileName2[])
{
    cout << "comparing files " << fileName1 << " and " << fileName2 << endl;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in1 (fileName1);
    OPENEXR_IMF_NAMESPACE::RgbaInputFile in2 (fileName2);

    assert (in1.dataWindow () == in2.dataWindow ());

    const Box2i& dw = in1.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);

    in1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    in2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);

    in1.readPixels (in1.dataWindow ().min.y, in1.dataWindow ().max.y);
    in2.readPixels (in2.dataWindow ().min.y, in2.dataWindow ().max.y);

    for (int i = 0; i < w * h; ++i)
    {
        assert (approximatelyEqual (pixels1[i].r, pixels2[i].r));
        assert (approximatelyEqual (pixels1[i].g, pixels2[i].g));
        assert (approximatelyEqual (pixels1[i].b, pixels2[i].b));
        assert (approximatelyEqual (pixels1[i].a, pixels2[i].a));
    }
}